

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O0

void __thiscall CHog::exportFeatVect(CHog *this,string *exportPath,int x,int y,int w,int h,int l)

{
  undefined1 auVar1 [16];
  int iVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  void *pvVar6;
  ostream *poVar7;
  int local_248;
  int local_244;
  int n;
  int j;
  int i;
  double *featVect;
  ofstream of;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  string *exportPath_local;
  CHog *this_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(&featVect,pcVar4,_S_app);
  iVar2 = x + 1;
  iVar3 = y + 1;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(w * h * this->hist[iVar3][iVar2].dim);
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar5);
  for (n = 0; n < h; n = n + 1) {
    for (local_244 = 0; local_244 < w; local_244 = local_244 + 1) {
      memcpy((void *)((long)pvVar6 +
                     (long)((n * w + local_244) * this->hist[iVar3 + n][iVar2 + local_244].dim) * 8)
             ,this->hist[iVar3 + n][iVar2 + local_244].feat,
             (long)this->hist[iVar3 + n][iVar2 + local_244].dim << 3);
    }
  }
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&featVect,l);
  std::operator<<(poVar7,"\t");
  for (local_248 = 0; local_248 < w * h * this->hist[iVar3][iVar2].dim; local_248 = local_248 + 1) {
    poVar7 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&featVect,*(double *)((long)pvVar6 + (long)local_248 * 8));
    std::operator<<(poVar7,"\t");
  }
  std::operator<<((ostream *)&featVect,"\n");
  std::ofstream::close();
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  std::ofstream::~ofstream(&featVect);
  return;
}

Assistant:

void CHog::exportFeatVect(string exportPath, int x, int y, int w, int h, int l)
{
    ofstream of(exportPath.c_str(), ios::app);
    x += 1;
    y += 1;
    double* featVect = new double[w*h*hist[y][x].dim];
    for(int i=0; i<h; i++)
    {
        for(int j=0; j<w; j++)
            memcpy(featVect+(i*w+j)*hist[y+i][x+j].dim, hist[y+i][x+j].feat, sizeof(double)*hist[y+i][x+j].dim);
    }
    of<<l<<"\t";
    for(int n=0; n<w*h*hist[y][x].dim; n++)
//        of<<n+1<<":"<<featVect[n]<<"\t";
        of<<featVect[n]<<"\t";
    of<<"\n";
    of.close();
    delete[] featVect;
}